

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  Iterator __begin3;
  Iterator __end3;
  Iterator local_48;
  Iterator local_38;
  
  iVar4 = this->max_has_bit_index_ + 0x1f;
  iVar6 = this->max_has_bit_index_ + 0x3e;
  if (-1 < iVar4) {
    iVar6 = iVar4;
  }
  local_48.idx = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)(iVar6 >> 5),(value_type_conflict4 *)&local_48,
             (allocator_type *)&local_38);
  local_48.descriptor = this->descriptor_;
  local_48.idx = 0;
  local_38.idx = *(int *)(local_48.descriptor + 4);
  local_38.descriptor = local_48.descriptor;
  while( true ) {
    bVar5 = operator==(&local_48,&local_38);
    if (bVar5) break;
    bVar3 = *(byte *)(*(long *)(local_48.descriptor + 0x28) + 1 + (long)local_48.idx * 0x48);
    if ((bVar3 & 0x60) == 0x40) {
      lVar1 = *(long *)(local_48.descriptor + 0x28) + (long)local_48.idx * 0x48;
      if ((bVar3 & 8) == 0) {
        plVar7 = (long *)(*(long *)(lVar1 + 0x20) + 0x28);
      }
      else if (*(long *)(lVar1 + 0x28) == 0) {
        plVar7 = (long *)(*(long *)(lVar1 + 0x10) + 0x70);
      }
      else {
        plVar7 = (long *)(*(long *)(lVar1 + 0x28) + 0x50);
      }
      iVar4 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)((ulong)(lVar1 - *plVar7) >> 3) * 0x38e38e39];
      iVar6 = iVar4 + 0x1f;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + (iVar6 >> 5);
      *puVar2 = *puVar2 | 1 << ((byte)iVar4 & 0x1f);
    }
    local_48.idx = local_48.idx + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32_t> masks(array_size, 0);

  for (auto field : FieldRange(descriptor_)) {
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |= static_cast<uint32_t>(1)
                                 << (has_bit_index % 32);
  }
  return masks;
}